

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_string.cpp
# Opt level: O3

void anon_unknown.dwarf_1ebe2c::test_error(string *str)

{
  bool bVar1;
  long *plVar2;
  long *plVar3;
  ostream *poVar4;
  ScopedTrace gtest_trace_28;
  string scope;
  events_aggregator_t handler;
  istringstream input;
  ScopedTrace local_209;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_208;
  AssertHelper local_200;
  long *local_1f8;
  long local_1f0;
  long local_1e8;
  long lStack_1e0;
  vector<sax_event_t,_std::allocator<sax_event_t>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [6];
  ios_base local_120 [264];
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_198,
                 "test error when parse \'",str);
  plVar2 = (long *)std::__cxx11::string::append(local_198._M_local_buf);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_1e8 = *plVar3;
    lStack_1e0 = plVar2[3];
    local_1f8 = &local_1e8;
  }
  else {
    local_1e8 = *plVar3;
    local_1f8 = (long *)*plVar2;
  }
  local_1f0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_allocated_capacity != local_188) {
    operator_delete((void *)local_198._M_allocated_capacity);
  }
  testing::Message::Message((Message *)&local_198._M_allocated_capacity);
  poVar4 = (ostream *)(local_198._M_allocated_capacity + 0x10);
  if ((long *)local_198._M_allocated_capacity == (long *)0x0) {
    poVar4 = (ostream *)0x0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_1f8,local_1f0);
  testing::internal::ScopedTrace::ScopedTrace
            (&local_209,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/andrusha97[P]loltoml/tests/multiline_string.cpp"
             ,0x1c,(Message *)&local_198._M_allocated_capacity);
  if ((long *)local_198._M_allocated_capacity != (long *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && ((long *)local_198._M_allocated_capacity != (long *)0x0)) {
      (**(code **)(*(long *)local_198._M_allocated_capacity + 8))();
    }
  }
  std::operator+(&local_1b8,"key = ",str);
  std::__cxx11::istringstream::istringstream
            ((istringstream *)local_198._M_local_buf,(string *)&local_1b8,_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  local_1d8.super__Vector_base<sax_event_t,_std::allocator<sax_event_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.super__Vector_base<sax_event_t,_std::allocator<sax_event_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.super__Vector_base<sax_event_t,_std::allocator<sax_event_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_1b8._M_string_length = 0;
    local_1b8.field_2._M_local_buf[0] = '\x01';
    local_1b8.field_2._8_8_ = &local_1d8;
    local_1b8._M_dataplus._M_p = (pointer)&local_198;
    loltoml::v_0_1_1::detail::parser_t<events_aggregator_t>::parse
              ((parser_t<events_aggregator_t> *)&local_1b8);
  }
  testing::Message::Message((Message *)&local_208);
  testing::internal::AssertHelper::AssertHelper
            (&local_200,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/andrusha97[P]loltoml/tests/multiline_string.cpp"
             ,0x21,
             "Expected: loltoml::parse(input, handler) throws an exception of type loltoml::parser_error_t.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_200,(Message *)&local_208);
  testing::internal::AssertHelper::~AssertHelper(&local_200);
  if (local_208.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_208.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_208.ptr_ + 8))();
    }
  }
  std::vector<sax_event_t,_std::allocator<sax_event_t>_>::~vector(&local_1d8);
  std::__cxx11::istringstream::~istringstream((istringstream *)local_198._M_local_buf);
  std::ios_base::~ios_base(local_120);
  testing::internal::ScopedTrace::~ScopedTrace(&local_209);
  if (local_1f8 != &local_1e8) {
    operator_delete(local_1f8);
  }
  return;
}

Assistant:

void test_error(const std::string &str) {
        std::string scope = "test error when parse '" + str + "'";
        SCOPED_TRACE(scope);

        std::istringstream input("key = " + str);
        events_aggregator_t handler;

        EXPECT_THROW(loltoml::parse(input, handler), loltoml::parser_error_t);
    }